

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

void Exa3_ManPrint(Exa3_Man_t *p,int i,int iMint,abctime clk)

{
  uint uVar1;
  undefined4 in_register_00000034;
  int level;
  uint local_1c;
  
  local_1c = iMint;
  printf("Iter%6d : ",CONCAT44(in_register_00000034,i));
  Extra_PrintBinary(_stdout,&local_1c,p->nVars);
  uVar1 = bmcg_sat_solver_varnum(p->pSat);
  printf("  Var =%5d  ",(ulong)uVar1);
  uVar1 = bmcg_sat_solver_clausenum(p->pSat);
  printf("Cla =%6d  ",(ulong)uVar1);
  uVar1 = bmcg_sat_solver_conflictnum(p->pSat);
  level = 0x9f747a;
  printf("Conf =%9d  ",(ulong)uVar1);
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)clk / 1000000.0);
  return;
}

Assistant:

void Exa3_ManPrint( Exa3_Man_t * p, int i, int iMint, abctime clk )
{
    printf( "Iter%6d : ", i );
    Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
    printf( "  Var =%5d  ", bmcg_sat_solver_varnum(p->pSat) );
    printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
    printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
    Abc_PrintTime( 1, "Time", clk );
}